

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::Buffers::FunctionalTest::PrepareInputBuffer(FunctionalTest *this)

{
  int iVar1;
  GLint GVar2;
  deUint32 dVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  TestContext *pTVar5;
  TestLog *pTVar6;
  MessageBuilder *pMVar7;
  MessageBuilder local_1240;
  MessageBuilder local_10c0;
  MessageBuilder local_f40;
  MessageBuilder local_dc0;
  MessageBuilder local_c40;
  MessageBuilder local_ac0;
  MessageBuilder local_940;
  MessageBuilder local_7c0;
  MessageBuilder local_640;
  MessageBuilder local_4c0;
  MessageBuilder local_340;
  MessageBuilder local_1b0;
  GLvoid *local_30;
  GLvoid *is_p;
  GLint *p;
  Functions *gl;
  FunctionalTest *this_local;
  
  gl = (Functions *)this;
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar4->_vptr_RenderContext[3])();
  p = (GLint *)CONCAT44(extraout_var,iVar1);
  (**(code **)(p + 0xee))(1,&this->m_bo_in);
  iVar1 = (**(code **)(p + 0x200))();
  if (iVar1 == 0) {
    (*this->m_pNamedBufferStorage)(this->m_bo_in,0x18,s_initial_data_a,0x142);
    iVar1 = (**(code **)(p + 0x200))();
    if (iVar1 == 0) {
      (*this->m_pClearNamedBufferSubData)
                (this->m_bo_in,0x8229,0,4,0x1903,0x1404,&PrepareInputBuffer::zero);
      iVar1 = (**(code **)(p + 0x200))();
      if (iVar1 == 0) {
        (*this->m_pNamedBufferSubData)(this->m_bo_in,4,4,&PrepareInputBuffer::one);
        iVar1 = (**(code **)(p + 0x200))();
        if (iVar1 == 0) {
          is_p = (*this->m_pMapNamedBuffer)(this->m_bo_in,0x88b9);
          iVar1 = (**(code **)(p + 0x200))();
          if ((iVar1 == 0) || (is_p == (GLvoid *)0x0)) {
            *(undefined4 *)((long)is_p + 8) = 2;
            (*this->m_pUnmapNamedBuffer)(this->m_bo_in);
            iVar1 = (**(code **)(p + 0x200))();
            if (iVar1 == 0) {
              (*this->m_pCopyNamedBufferSubData)(this->m_bo_in,this->m_bo_in,0xc,0x10,4);
              iVar1 = (**(code **)(p + 0x200))();
              if (iVar1 == 0) {
                is_p = (*this->m_pMapNamedBufferRange)(this->m_bo_in,0xc,4,0x52);
                iVar1 = (**(code **)(p + 0x200))();
                if (iVar1 == 0) {
                  *(undefined4 *)is_p = 3;
                  (*this->m_pFlushMappedNamedBufferRange)(this->m_bo_in,0,4);
                  iVar1 = (**(code **)(p + 0x200))();
                  if (iVar1 == 0) {
                    local_30 = (GLvoid *)0x0;
                    (*this->m_pGetNamedBufferPointerv)(this->m_bo_in,0x88bd,&local_30);
                    iVar1 = (**(code **)(p + 0x200))();
                    if (iVar1 == 0) {
                      if (is_p == local_30) {
                        (*this->m_pUnmapNamedBuffer)(this->m_bo_in);
                        iVar1 = (**(code **)(p + 0x200))();
                        if (iVar1 == 0) {
                          GVar2 = (**(code **)(p + 0x1e0))(this->m_po,"data_in");
                          this->m_attrib_location = GVar2;
                          dVar3 = (**(code **)(p + 0x200))();
                          glu::checkError(dVar3,"glGetAttribLocation call failed.",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                                          ,0x15d1);
                          (**(code **)(p + 0x10))(0x8892,this->m_bo_in);
                          dVar3 = (**(code **)(p + 0x200))();
                          glu::checkError(dVar3,"glBindBuffer call failed.",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                                          ,0x15d4);
                          (**(code **)(p + 0x656))(this->m_attrib_location,1,0x1404,0,0);
                          dVar3 = (**(code **)(p + 0x200))();
                          glu::checkError(dVar3,"glVertexAttribIPointer call failed.",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                                          ,0x15d8);
                          (**(code **)(p + 0x184))(this->m_attrib_location);
                          dVar3 = (**(code **)(p + 0x200))();
                          glu::checkError(dVar3,"glEnableVertexAttribArray call failed.",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                                          ,0x15dc);
                          return true;
                        }
                        pTVar5 = deqp::Context::getTestContext((this->super_TestCase).m_context);
                        pTVar6 = tcu::TestContext::getLog(pTVar5);
                        tcu::TestLog::operator<<
                                  (&local_1b0,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
                        pMVar7 = tcu::MessageBuilder::operator<<
                                           (&local_1b0,(char (*) [29])"UnmapNamedBuffer has failed."
                                           );
                        tcu::MessageBuilder::operator<<
                                  (pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
                        tcu::MessageBuilder::~MessageBuilder(&local_1b0);
                      }
                      else {
                        (*this->m_pUnmapNamedBuffer)(this->m_bo_in);
                        pTVar5 = deqp::Context::getTestContext((this->super_TestCase).m_context);
                        pTVar6 = tcu::TestContext::getLog(pTVar5);
                        tcu::TestLog::operator<<
                                  (&local_340,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
                        pMVar7 = tcu::MessageBuilder::operator<<
                                           (&local_340,
                                            (char (*) [58])
                                            "Pointer returned by GetNamedBufferPointerv is not proper."
                                           );
                        tcu::MessageBuilder::operator<<
                                  (pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
                        tcu::MessageBuilder::~MessageBuilder(&local_340);
                      }
                    }
                    else {
                      (*this->m_pUnmapNamedBuffer)(this->m_bo_in);
                      pTVar5 = deqp::Context::getTestContext((this->super_TestCase).m_context);
                      pTVar6 = tcu::TestContext::getLog(pTVar5);
                      tcu::TestLog::operator<<
                                (&local_4c0,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
                      pMVar7 = tcu::MessageBuilder::operator<<
                                         (&local_4c0,
                                          (char (*) [35])"GetNamedBufferPointerv has failed.");
                      tcu::MessageBuilder::operator<<
                                (pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
                      tcu::MessageBuilder::~MessageBuilder(&local_4c0);
                    }
                  }
                  else {
                    (*this->m_pUnmapNamedBuffer)(this->m_bo_in);
                    pTVar5 = deqp::Context::getTestContext((this->super_TestCase).m_context);
                    pTVar6 = tcu::TestContext::getLog(pTVar5);
                    tcu::TestLog::operator<<
                              (&local_640,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
                    pMVar7 = tcu::MessageBuilder::operator<<
                                       (&local_640,
                                        (char (*) [40])"FlushMappedNamedBufferRange has failed.");
                    tcu::MessageBuilder::operator<<
                              (pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
                    tcu::MessageBuilder::~MessageBuilder(&local_640);
                  }
                }
                else {
                  pTVar5 = deqp::Context::getTestContext((this->super_TestCase).m_context);
                  pTVar6 = tcu::TestContext::getLog(pTVar5);
                  tcu::TestLog::operator<<
                            (&local_7c0,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
                  pMVar7 = tcu::MessageBuilder::operator<<
                                     (&local_7c0,(char (*) [32])"MapNamedBufferRange has failed.");
                  tcu::MessageBuilder::operator<<
                            (pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
                  tcu::MessageBuilder::~MessageBuilder(&local_7c0);
                }
              }
              else {
                pTVar5 = deqp::Context::getTestContext((this->super_TestCase).m_context);
                pTVar6 = tcu::TestContext::getLog(pTVar5);
                tcu::TestLog::operator<<
                          (&local_940,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
                pMVar7 = tcu::MessageBuilder::operator<<
                                   (&local_940,(char (*) [35])"CopyNamedBufferSubData has failed.");
                tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                tcu::MessageBuilder::~MessageBuilder(&local_940);
              }
            }
            else {
              pTVar5 = deqp::Context::getTestContext((this->super_TestCase).m_context);
              pTVar6 = tcu::TestContext::getLog(pTVar5);
              tcu::TestLog::operator<<
                        (&local_ac0,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
              pMVar7 = tcu::MessageBuilder::operator<<
                                 (&local_ac0,(char (*) [29])"UnmapNamedBuffer has failed.");
              tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
              tcu::MessageBuilder::~MessageBuilder(&local_ac0);
            }
          }
          else {
            pTVar5 = deqp::Context::getTestContext((this->super_TestCase).m_context);
            pTVar6 = tcu::TestContext::getLog(pTVar5);
            tcu::TestLog::operator<<(&local_c40,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
            pMVar7 = tcu::MessageBuilder::operator<<
                               (&local_c40,(char (*) [27])"MapNamedBuffer has failed.");
            tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder(&local_c40);
          }
        }
        else {
          pTVar5 = deqp::Context::getTestContext((this->super_TestCase).m_context);
          pTVar6 = tcu::TestContext::getLog(pTVar5);
          tcu::TestLog::operator<<(&local_dc0,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar7 = tcu::MessageBuilder::operator<<(&local_dc0,(char (*) [31])0x2a6966e);
          tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_dc0);
        }
      }
      else {
        pTVar5 = deqp::Context::getTestContext((this->super_TestCase).m_context);
        pTVar6 = tcu::TestContext::getLog(pTVar5);
        tcu::TestLog::operator<<(&local_f40,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar7 = tcu::MessageBuilder::operator<<
                           (&local_f40,(char (*) [36])"ClearNamedBufferSubData has failed.");
        tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_f40);
      }
    }
    else {
      pTVar5 = deqp::Context::getTestContext((this->super_TestCase).m_context);
      pTVar6 = tcu::TestContext::getLog(pTVar5);
      tcu::TestLog::operator<<(&local_10c0,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar7 = tcu::MessageBuilder::operator<<
                         (&local_10c0,(char (*) [31])"NamedBufferStorage has failed.");
      tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_10c0);
    }
  }
  else {
    pTVar5 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar6 = tcu::TestContext::getLog(pTVar5);
    tcu::TestLog::operator<<(&local_1240,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<(&local_1240,(char (*) [26])"CreateBuffers has failed.")
    ;
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1240);
  }
  return false;
}

Assistant:

bool FunctionalTest::PrepareInputBuffer()
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Constants. */
	static const glw::GLint zero = 0;
	static const glw::GLint one  = 1;

	/* Buffer preparation */
	gl.createBuffers(1, &m_bo_in);

	if (GL_NO_ERROR == gl.getError())
	{
		/* Storage and last (6th) element preparation. */
		m_pNamedBufferStorage(m_bo_in, sizeof(s_initial_data_a), s_initial_data_a,
							  GL_MAP_WRITE_BIT | GL_DYNAMIC_STORAGE_BIT | GL_MAP_PERSISTENT_BIT);

		if (GL_NO_ERROR == gl.getError())
		{
			/* First element preparation. */
			m_pClearNamedBufferSubData(m_bo_in, GL_R8, 0, sizeof(glw::GLint), GL_RED, GL_INT, &zero);

			if (GL_NO_ERROR == gl.getError())
			{
				/* Second element preparation. */
				m_pNamedBufferSubData(m_bo_in, 1 /* 2nd element */ * sizeof(glw::GLint), sizeof(glw::GLint), &one);

				if (GL_NO_ERROR == gl.getError())
				{
					/* Third element preparation. */
					glw::GLint* p = (glw::GLint*)m_pMapNamedBuffer(m_bo_in, GL_WRITE_ONLY);

					if ((GL_NO_ERROR == gl.getError()) || (DE_NULL == p))
					{
						p[2] = 2;

						m_pUnmapNamedBuffer(m_bo_in);

						if (GL_NO_ERROR == gl.getError())
						{
							/* Fifth element preparation. */
							m_pCopyNamedBufferSubData(m_bo_in, m_bo_in, sizeof(glw::GLint) * 3, sizeof(glw::GLint) * 4,
													  sizeof(glw::GLint));

							if (GL_NO_ERROR == gl.getError())
							{
								/* Fourth element preparation. */
								p = (glw::GLint*)m_pMapNamedBufferRange(
									m_bo_in, sizeof(glw::GLint) * 3, sizeof(glw::GLint),
									GL_MAP_WRITE_BIT | GL_MAP_PERSISTENT_BIT | GL_MAP_FLUSH_EXPLICIT_BIT);

								if (GL_NO_ERROR == gl.getError())
								{
									/* Write to mapped buffer. */
									*p = 3;

									/* Flush test. */
									m_pFlushMappedNamedBufferRange(m_bo_in, 0, sizeof(glw::GLint));

									if (GL_NO_ERROR == gl.getError())
									{
										/* Mapped Buffer Pointer query. */
										glw::GLvoid* is_p = DE_NULL;
										m_pGetNamedBufferPointerv(m_bo_in, GL_BUFFER_MAP_POINTER, &is_p);

										if (GL_NO_ERROR == gl.getError())
										{
											/* Mapped Buffer pointer query check. */
											if (p == is_p)
											{
												/* Unmapping. */
												m_pUnmapNamedBuffer(m_bo_in);

												if (GL_NO_ERROR == gl.getError())
												{
													/* Setup buffer as input for vertex shader. */
													m_attrib_location =
														gl.getAttribLocation(m_po, s_vertex_shader_input_name);
													GLU_EXPECT_NO_ERROR(gl.getError(),
																		"glGetAttribLocation call failed.");

													gl.bindBuffer(GL_ARRAY_BUFFER, m_bo_in);
													GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer call failed.");

													gl.vertexAttribIPointer(m_attrib_location, 1, GL_INT, 0, NULL);
													GLU_EXPECT_NO_ERROR(gl.getError(),
																		"glVertexAttribIPointer call failed.");

													gl.enableVertexAttribArray(m_attrib_location);
													GLU_EXPECT_NO_ERROR(gl.getError(),
																		"glEnableVertexAttribArray call failed.");

													return true;
												}
												else
												{
													m_context.getTestContext().getLog()
														<< tcu::TestLog::Message << "UnmapNamedBuffer has failed."
														<< tcu::TestLog::EndMessage;
												}
											}
											else
											{
												m_pUnmapNamedBuffer(m_bo_in);
												m_context.getTestContext().getLog()
													<< tcu::TestLog::Message
													<< "Pointer returned by GetNamedBufferPointerv is not proper."
													<< tcu::TestLog::EndMessage;
											}
										}
										else
										{
											m_pUnmapNamedBuffer(m_bo_in);
											m_context.getTestContext().getLog() << tcu::TestLog::Message
																				<< "GetNamedBufferPointerv has failed."
																				<< tcu::TestLog::EndMessage;
										}
									}
									else
									{
										m_pUnmapNamedBuffer(m_bo_in);
										m_context.getTestContext().getLog() << tcu::TestLog::Message
																			<< "FlushMappedNamedBufferRange has failed."
																			<< tcu::TestLog::EndMessage;
									}
								}
								else
								{
									m_context.getTestContext().getLog() << tcu::TestLog::Message
																		<< "MapNamedBufferRange has failed."
																		<< tcu::TestLog::EndMessage;
								}
							}
							else
							{
								m_context.getTestContext().getLog() << tcu::TestLog::Message
																	<< "CopyNamedBufferSubData has failed."
																	<< tcu::TestLog::EndMessage;
							}
						}
						else
						{
							m_context.getTestContext().getLog()
								<< tcu::TestLog::Message << "UnmapNamedBuffer has failed." << tcu::TestLog::EndMessage;
						}
					}
					else
					{
						m_context.getTestContext().getLog() << tcu::TestLog::Message << "MapNamedBuffer has failed."
															<< tcu::TestLog::EndMessage;
					}
				}
				else
				{
					m_context.getTestContext().getLog() << tcu::TestLog::Message << "NamedBufferSubData has failed."
														<< tcu::TestLog::EndMessage;
				}
			}
			else
			{
				m_context.getTestContext().getLog() << tcu::TestLog::Message << "ClearNamedBufferSubData has failed."
													<< tcu::TestLog::EndMessage;
			}
		}
		else
		{
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "NamedBufferStorage has failed."
												<< tcu::TestLog::EndMessage;
		}
	}
	else
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "CreateBuffers has failed."
											<< tcu::TestLog::EndMessage;
	}

	return false;
}